

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManSetIfParsDefault(void *pp)

{
  memset((void *)((long)pp + 0x10),0,0x120);
  *(undefined8 *)pp = 0x8ffffffff;
  *(undefined8 *)((long)pp + 8) = 0x200000001;
  *(undefined8 *)((long)pp + 0x18) = 0x3ba3d70abf800000;
  *(undefined4 *)((long)pp + 0x30) = 1;
  *(undefined8 *)((long)pp + 0x38) = 0x100000000;
  *(undefined4 *)((long)pp + 0x44) = 1;
  *(undefined4 *)((long)pp + 0x4c) = 0;
  *(undefined8 *)((long)pp + 0xa8) = 0;
  *(undefined4 *)((long)pp + 0xd4) = 0;
  *(undefined8 *)((long)pp + 0xe4) = 0x100000000;
  *(undefined8 *)((long)pp + 0xf8) = 0;
  *(undefined8 *)((long)pp + 0x100) = 0;
  *(undefined8 *)((long)pp + 0x108) = 0;
  *(undefined8 *)((long)pp + 0x110) = 0;
  return;
}

Assistant:

void Gia_ManSetIfParsDefault( void * pp )
{
    If_Par_t * pPars = (If_Par_t *)pp;
//    extern void * Abc_FrameReadLibLut();
    If_Par_t * p = (If_Par_t *)pPars;
    // set defaults
    memset( p, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    p->nLutSize    = -1;
//    p->nLutSize    =  6;
    p->nCutsMax    =  8;
    p->nFlowIters  =  1;
    p->nAreaIters  =  2;
    p->DelayTarget = -1;
    p->Epsilon     =  (float)0.005;
    p->fPreprocess =  1;
    p->fArea       =  0;
    p->fFancy      =  0;
    p->fExpRed     =  1; ////
    p->fLatchPaths =  0;
    p->fEdge       =  1;
    p->fPower      =  0;
    p->fCutMin     =  0;
    p->fVerbose    =  0;
    p->pLutStruct  =  NULL;
    // internal parameters
    p->fTruth      =  0;
    p->nLatchesCi  =  0;
    p->nLatchesCo  =  0;
    p->fLiftLeaves =  0;
    p->fUseCoAttrs =  1;   // use CO attributes
    p->pLutLib     =  NULL;
    p->pTimesArr   =  NULL; 
    p->pTimesReq   =  NULL;   
    p->pFuncCost   =  NULL;   
}